

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModel.cpp
# Opt level: O2

void __thiscall HighsModel::userCostScale(HighsModel *this,HighsInt user_cost_scale)

{
  uint uVar1;
  pointer pdVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int __exponent;
  double dVar6;
  
  __exponent = user_cost_scale - (this->lp_).user_cost_scale_;
  if (__exponent == 0) {
    return;
  }
  dVar6 = ldexp(1.0,__exponent);
  lVar3 = (long)(this->hessian_).dim_;
  if (lVar3 != 0) {
    pdVar2 = (this->hessian_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = (this->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar2[uVar5] = pdVar2[uVar5] * dVar6;
    }
  }
  HighsLp::userCostScale(&this->lp_,user_cost_scale);
  return;
}

Assistant:

void HighsModel::userCostScale(const HighsInt user_cost_scale) {
  const HighsInt dl_user_cost_scale =
      user_cost_scale - this->lp_.user_cost_scale_;
  if (!dl_user_cost_scale) return;
  double dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  if (this->hessian_.dim_) {
    for (HighsInt iEl = 0; iEl < this->hessian_.start_[this->hessian_.dim_];
         iEl++)
      this->hessian_.value_[iEl] *= dl_user_cost_scale_value;
  }
  this->lp_.userCostScale(user_cost_scale);
}